

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O3

ulong __thiscall nuraft::inmem_log_store::term_at(inmem_log_store *this,ulong index)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  ulong uVar3;
  _Base_ptr *pp_Var4;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->logs_lock_);
  if (iVar5 == 0) {
    p_Var2 = (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var8->_M_header;
    p_Var7 = p_Var2;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        p_Var1 = p_Var7 + 1;
        if (*(ulong *)p_Var1 >= index) {
          p_Var6 = p_Var7;
        }
        pp_Var4 = &p_Var7->_M_left;
        p_Var7 = pp_Var4[*(ulong *)p_Var1 < index];
      } while (pp_Var4[*(ulong *)p_Var1 < index] != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 == p_Var8) || (index < *(ulong *)(p_Var6 + 1))) {
        do {
          p_Var7 = p_Var2;
          p_Var2 = p_Var7->_M_left;
        } while (p_Var7->_M_left != (_Base_ptr)0x0);
        p_Var6 = &p_Var8->_M_header;
        if (((_Rb_tree_header *)p_Var7 != p_Var8) && (*(long *)(p_Var7 + 1) == 0)) {
          p_Var6 = p_Var7;
        }
      }
    }
    uVar3 = *(ulong *)p_Var6[1]._M_parent;
    pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
    return uVar3;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

ulong inmem_log_store::term_at(ulong index) {
    ulong term = 0;
    {   std::lock_guard<std::mutex> l(logs_lock_);
        auto entry = logs_.find(index);
        if (entry == logs_.end()) {
            entry = logs_.find(0);
        }
        term = entry->second->get_term();
    }
    return term;
}